

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int mbedtls_sha1(uchar *input,size_t ilen,uchar *output)

{
  mbedtls_sha1_context ctx;
  int ret;
  uchar *in_stack_ffffffffffffff98;
  mbedtls_sha1_context *in_stack_ffffffffffffffa0;
  mbedtls_sha1_context *in_stack_ffffffffffffffa8;
  int local_1c;
  
  mbedtls_sha1_init((mbedtls_sha1_context *)0x864773);
  local_1c = mbedtls_sha1_starts((mbedtls_sha1_context *)&stack0xffffffffffffff88);
  if ((local_1c == 0) &&
     (local_1c = mbedtls_sha1_update(in_stack_ffffffffffffffa8,(uchar *)in_stack_ffffffffffffffa0,
                                     (size_t)in_stack_ffffffffffffff98), local_1c == 0)) {
    local_1c = mbedtls_sha1_finish(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  mbedtls_sha1_free((mbedtls_sha1_context *)0x8647c5);
  return local_1c;
}

Assistant:

int mbedtls_sha1(const unsigned char *input,
                 size_t ilen,
                 unsigned char output[20])
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init(&ctx);

    if ((ret = mbedtls_sha1_starts(&ctx)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha1_update(&ctx, input, ilen)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha1_finish(&ctx, output)) != 0) {
        goto exit;
    }

exit:
    mbedtls_sha1_free(&ctx);
    return ret;
}